

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

bool checkrelrefs(LinkedSection *ls,Section *newsec)

{
  bool bVar1;
  Section *in_RSI;
  long in_RDI;
  Section *sec;
  Section *local_20;
  
  local_20 = *(Section **)(in_RDI + 0x68);
  while( true ) {
    if ((local_20->n).next == (node *)0x0) {
      return 0;
    }
    bVar1 = checkrr(local_20->relrefs,in_RSI);
    if (bVar1 != 0) break;
    bVar1 = checkrr(in_RSI->relrefs,local_20);
    if (bVar1 != 0) {
      return 1;
    }
    local_20 = (Section *)(local_20->n).next;
  }
  return 1;
}

Assistant:

static bool checkrelrefs(struct LinkedSection *ls,struct Section *newsec)
/* Check if there is a relative reference between those sections */
{
  struct Section *sec;

  for (sec=(struct Section *)ls->sections.first;
       sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
    /* check for references to 'newsec' */
    if (checkrr(sec->relrefs,newsec))
      return (TRUE);
    /* check for references from 'newsec' */
    if (checkrr(newsec->relrefs,sec))
      return (TRUE);
  }
  return (FALSE);
}